

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec-vary.c
# Opt level: O2

_Bool set_preferred_target_page_bits_x86_64(uc_struct_conflict *uc,int bits)

{
  return true;
}

Assistant:

bool set_preferred_target_page_bits(struct uc_struct *uc, int bits)
{
    /*
     * The target page size is the lowest common denominator for all
     * the CPUs in the system, so we can only make it smaller, never
     * larger. And we can't make it smaller once we've committed to
     * a particular size.
     */
#ifdef TARGET_PAGE_BITS_VARY
    //assert(bits >= TARGET_PAGE_BITS_MIN);
    if (uc->init_target_page == NULL) {
        uc->init_target_page = calloc(1, sizeof(TargetPageBits));
    } else {
        return false;
    }

    if (bits < TARGET_PAGE_BITS_MIN) {
        return false;
    }

    if (uc->init_target_page->bits == 0 || uc->init_target_page->bits > bits) {
        if (uc->init_target_page->decided) {
            return false;
        }
        uc->init_target_page->bits = bits;
    }
#endif
    return true;
}